

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogUnixServer.cpp
# Opt level: O0

void __thiscall liblogger::LogUnixServer::Log(LogUnixServer *this,LogType Type,string *str)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  string *message;
  int *piVar6;
  char *pcVar7;
  size_t sVar8;
  value_type_conflict3 *__x;
  reference piVar9;
  LogType in_ESI;
  LogException *in_RDI;
  int fd_1;
  iterator __end2_1;
  iterator __begin2_1;
  list<int,_std::allocator<int>_> *__range2_1;
  ssize_t ret;
  ssize_t offset;
  int fd;
  iterator __end2;
  iterator __begin2;
  list<int,_std::allocator<int>_> *__range2;
  int len;
  list<int,_std::allocator<int>_> broken;
  stringstream ss;
  char buf [128];
  tm timeinfo;
  time_t current;
  char *msg;
  list<int,_std::allocator<int>_> *in_stack_fffffffffffffca8;
  list<int,_std::allocator<int>_> *in_stack_fffffffffffffcc0;
  int local_314;
  _Self local_310;
  _Self local_308;
  undefined1 *local_300;
  value_type_conflict3 *local_2f8;
  long local_2f0;
  int local_2e4;
  _Self local_2e0;
  _Self local_2d8;
  size_type *local_2d0;
  int local_2c4;
  undefined1 local_2c0 [31];
  undefined1 local_2a1;
  stringstream local_270 [16];
  ostream local_260 [376];
  char local_e8 [136];
  tm local_60;
  time_t local_28;
  char *local_20 [2];
  LogType local_c;
  
  local_20[0] = (char *)0x0;
  local_c = in_ESI;
  local_28 = time((time_t *)0x0);
  localtime_r(&local_28,&local_60);
  strftime(local_e8,0x80,"%F %T",&local_60);
  LogTypeToStr_abi_cxx11_(local_c);
  uVar4 = std::__cxx11::string::c_str();
  uVar2 = getpid();
  uVar5 = std::__cxx11::string::c_str();
  iVar3 = asprintf(local_20,"%s - %s [PID: %d] - %s\n",local_e8,uVar4,(ulong)uVar2,uVar5);
  if (iVar3 < 0) {
    std::__cxx11::stringstream::stringstream(local_270);
    message = (string *)std::operator<<(local_260,"asprintf failed error:");
    piVar6 = __errno_location();
    pcVar7 = strerror(*piVar6);
    std::operator<<((ostream *)message,pcVar7);
    local_2a1 = 1;
    uVar4 = __cxa_allocate_exception(0x28);
    std::__cxx11::stringstream::str();
    LogException::LogException(in_RDI,message);
    local_2a1 = 0;
    __cxa_throw(uVar4,&LogException::typeinfo,LogException::~LogException);
  }
  std::__cxx11::list<int,_std::allocator<int>_>::list((list<int,_std::allocator<int>_> *)0x1afe99);
  sVar8 = strlen(local_20[0]);
  local_2c4 = (int)sVar8;
  Lock((LogUnixServer *)0x1afeb7);
  local_2d0 = &in_RDI[1].m_message._M_string_length;
  local_2d8._M_node =
       (_List_node_base *)
       std::__cxx11::list<int,_std::allocator<int>_>::begin(in_stack_fffffffffffffca8);
  local_2e0._M_node =
       (_List_node_base *)
       std::__cxx11::list<int,_std::allocator<int>_>::end(in_stack_fffffffffffffca8);
  while (bVar1 = std::operator!=(&local_2d8,&local_2e0), bVar1) {
    piVar9 = std::_List_iterator<int>::operator*((_List_iterator<int> *)0x1aff19);
    local_2e4 = *piVar9;
    local_2f0 = 0;
    local_2f8 = (value_type_conflict3 *)0x0;
    do {
      __x = (value_type_conflict3 *)write(local_2e4,local_20[0] + local_2f0,local_2c4 - local_2f0);
      local_2f8 = __x;
      if ((long)__x < 0) {
        piVar6 = __errno_location();
        if (*piVar6 == 4) {
          local_2f8 = (value_type_conflict3 *)0x0;
        }
      }
      else {
        local_2f0 = local_2c4 + local_2f0;
      }
    } while (local_2f0 < local_2c4);
    if (((long)local_2f8 < (long)local_2c4) || (local_2f8 == (value_type_conflict3 *)0x0)) {
      std::__cxx11::list<int,_std::allocator<int>_>::push_back(in_stack_fffffffffffffcc0,__x);
    }
    std::_List_iterator<int>::operator++(&local_2d8);
  }
  local_300 = local_2c0;
  local_308._M_node =
       (_List_node_base *)
       std::__cxx11::list<int,_std::allocator<int>_>::begin(in_stack_fffffffffffffca8);
  local_310._M_node =
       (_List_node_base *)
       std::__cxx11::list<int,_std::allocator<int>_>::end(in_stack_fffffffffffffca8);
  while( true ) {
    bVar1 = std::operator!=(&local_308,&local_310);
    if (!bVar1) {
      Unlock((LogUnixServer *)0x1b00b9);
      std::__cxx11::list<int,_std::allocator<int>_>::~list
                ((list<int,_std::allocator<int>_> *)0x1b00c8);
      free(local_20[0]);
      return;
    }
    piVar9 = std::_List_iterator<int>::operator*((_List_iterator<int> *)0x1b0069);
    local_314 = *piVar9;
    iVar3 = close(local_314);
    if (iVar3 < 0) break;
    std::__cxx11::list<int,_std::allocator<int>_>::remove
              ((list<int,_std::allocator<int>_> *)&in_RDI[1].m_message._M_string_length,
               (char *)&local_314);
    std::_List_iterator<int>::operator++(&local_308);
  }
  abort();
}

Assistant:

void LogUnixServer::Log(const LogType Type, const std::string &str) {
	char *msg = NULL;

	time_t current = time(NULL);
	struct tm timeinfo;
	char buf[128];

	localtime_r(&current, &timeinfo);
	strftime(buf, sizeof(buf), "%F %T", &timeinfo);

	if (asprintf(&msg, "%s - %s [PID: %d] - %s\n", buf, LogTypeToStr(Type).c_str(), getpid(), str.c_str()) < 0)
	{
		std::stringstream ss;
		ss << "asprintf failed error:" << strerror(errno);
		throw(LogException(ss.str()));
	}
	else
	{
		std::list<int> broken;
		int len = strlen(msg);

		Lock();

		for(auto fd : m_list)
		{
			ssize_t offset = 0;
			ssize_t ret = 0;
			do
			{
				ret = write(fd, msg + offset, len - offset);
				if (ret < 0)
				{
					switch(errno)
					{
						case EINTR:
							ret = 0; //Fudge this as if we didn't write anything
							break;
						default:
							break;
					}
				}
				else
				{
					offset += len;
				}
			} while(offset < len);

			if (ret < len || ret == 0)
			{
				broken.push_back(fd);
			}
		}

		//Kick any broken clients
		for(auto fd : broken)
		{
			if (close(fd) < 0)
			{
				abort();
			}
			m_list.remove(fd);
		}

		Unlock();

	}
	free(msg);
}